

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

void AM_restoreScaleAndLoc(void)

{
  AActor *pAVar1;
  
  m_w = old_m_w;
  m_h = old_m_h;
  if (am_followplayer.Value) {
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
    m_x = (pAVar1->__Pos).X - m_w * 0.5;
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
    m_y = (pAVar1->__Pos).Y - m_h * 0.5;
  }
  else {
    m_x = old_m_x;
    m_y = old_m_y;
  }
  m_x2 = m_x + m_w;
  m_y2 = m_h + m_y;
  scale_mtof = (double)f_w / m_w;
  scale_ftom = 1.0 / ((double)f_w / m_w);
  return;
}

Assistant:

void AM_restoreScaleAndLoc ()
{
	m_w = old_m_w;
	m_h = old_m_h;
	if (!am_followplayer)
	{
		m_x = old_m_x;
		m_y = old_m_y;
    }
	else
	{
		m_x = players[consoleplayer].camera->X() - m_w/2;
		m_y = players[consoleplayer].camera->Y() - m_h/2;
    }
	m_x2 = m_x + m_w;
	m_y2 = m_y + m_h;

	// Change the scaling multipliers
	scale_mtof = f_w / m_w;
	scale_ftom = 1. / scale_mtof;
}